

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O1

void __thiscall
dg::debug::DG2Dot<dg::LLVMNode>::dumpSubgraphStart
          (DG2Dot<dg::LLVMNode> *this,DependenceGraph<dg::LLVMNode> *sub,char *name)

{
  ofstream *poVar1;
  ostream *poVar2;
  size_t sVar3;
  
  poVar1 = &this->out;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t/* subgraph ",0xd);
  poVar2 = std::ostream::_M_insert<void_const*>(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," nodes */\n",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tsubgraph cluster_",0x12);
  poVar2 = std::ostream::_M_insert<void_const*>(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," {\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"\t\tstyle=\"filled, rounded\" fillcolor=gray95\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t\tlabel=\"Subgraph ",0x12)
  ;
  if (name != (char *)0x0) {
    sVar3 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,name,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," ",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
  poVar2 = std::ostream::_M_insert<void_const*>(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\\nhas ",6);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," nodes\n",7);
  if ((sub->super_DependenceGraphBase).slice_id != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\\nslice: ",9);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\"\n",2);
  if (sub->formalParameters != (DGParameters<dg::LLVMNode> *)0x0) {
    dump_parameters(this,sub->formalParameters,2,true);
    return;
  }
  return;
}

Assistant:

void dumpSubgraphStart(DependenceGraph<NodeT> *sub,
                           const char *name = nullptr) {
        out << "\t/* subgraph " << sub << " nodes */\n";
        out << "\tsubgraph cluster_" << sub << " {\n";
        out << "\t\tstyle=\"filled, rounded\" fillcolor=gray95\n";
        out << "\t\tlabel=\"Subgraph ";
        if (name)
            out << name << " ";

        out << "[" << sub << "]"
            << "\\nhas " << sub->size() << " nodes\n";

        uint64_t slice_id = sub->getSlice();
        if (slice_id != 0)
            out << "\\nslice: " << slice_id;

        out << "\"\n";

        // dump BBs of the formal parameters
        dump_parameters(sub, 2);
    }